

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O0

void trico_compress(uint32_t *nr_of_compressed_bytes,uint8_t **out,float *input,
                   uint32_t number_of_floats,uint32_t hash1_size_exponent,
                   uint32_t hash2_size_exponent)

{
  float value_00;
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  void *ptr;
  void *ptr_00;
  uint local_f4;
  uint local_f0;
  uint32_t l;
  uint32_t i;
  uint8_t hash_info;
  uint8_t *p_out;
  uint32_t local_d8;
  uint32_t j;
  uint32_t bcode [8];
  uint32_t xor2 [8];
  uint32_t xor1 [8];
  int local_6c;
  uint local_68;
  uint32_t prediction2;
  uint32_t prediction1;
  uint32_t hash2;
  uint32_t hash1;
  uint32_t last_value;
  uint32_t stride;
  uint32_t value;
  uint32_t *hash_table_2;
  uint32_t *hash_table_1;
  uint32_t hash2_mask;
  uint32_t hash1_mask;
  uint32_t hash2_size;
  uint32_t hash1_size;
  uint32_t max_size;
  uint32_t hash2_size_exponent_local;
  uint32_t hash1_size_exponent_local;
  uint32_t number_of_floats_local;
  float *input_local;
  uint8_t **out_local;
  uint32_t *nr_of_compressed_bytes_local;
  
  max_size = hash1_size_exponent & 0xfffffffe;
  hash1_size = hash2_size_exponent & 0xfffffffe;
  if (0x1e < max_size) {
    max_size = 0x1e;
  }
  if (0x1e < hash1_size) {
    hash1_size = 0x1e;
  }
  puVar4 = (uint8_t *)
           trico_malloc((ulong)(number_of_floats * 4 + ((number_of_floats + 7) * 3 >> 3) +
                               (number_of_floats & 7)));
  *out = puVar4;
  uVar2 = 1 << ((byte)max_size & 0x1f);
  uVar3 = 1 << ((byte)hash1_size & 0x1f);
  ptr = trico_calloc((ulong)uVar2,4);
  ptr_00 = trico_calloc((ulong)uVar3,4);
  hash2 = 0;
  prediction1 = 0;
  prediction2 = 0;
  local_68 = 0;
  local_6c = 0;
  p_out._4_4_ = 0;
  pbVar1 = *out;
  *pbVar1 = (byte)((max_size >> 1) << 4) | (byte)(hash1_size >> 1);
  pbVar1[1] = (byte)(number_of_floats >> 0x18);
  pbVar1[2] = (byte)(number_of_floats >> 0x10);
  pbVar1[3] = (byte)(number_of_floats >> 8);
  _i = pbVar1 + 5;
  pbVar1[4] = (byte)number_of_floats;
  _hash1_size_exponent_local = input;
  for (local_f0 = 0; local_f4 = p_out._4_4_, local_f0 < number_of_floats; local_f0 = local_f0 + 1) {
    p_out._4_4_ = local_f0 & 7;
    value_00 = *_hash1_size_exponent_local;
    xor2[(ulong)p_out._4_4_ + 6] = (uint)value_00 ^ local_68;
    *(float *)((long)ptr + (ulong)prediction1 * 4) = value_00;
    prediction1 = trico_compute_hash1_32(prediction1,(uint32_t)value_00,max_size,uVar2 - 1);
    local_68 = *(uint *)((long)ptr + (ulong)prediction1 * 4);
    bcode[(ulong)p_out._4_4_ + 6] = (uint)value_00 ^ hash2 + local_6c;
    *(uint32_t *)((long)ptr_00 + (ulong)prediction2 * 4) = (int)value_00 - hash2;
    prediction2 = trico_compute_hash2_32(prediction2,(int)value_00 - hash2,hash1_size,uVar3 - 1);
    local_6c = *(int *)((long)ptr_00 + (ulong)prediction2 * 4);
    (&local_d8)[p_out._4_4_] = 4;
    if (xor2[(ulong)p_out._4_4_ + 6] == 0) {
      (&local_d8)[p_out._4_4_] = 0;
    }
    else if (xor2[(ulong)p_out._4_4_ + 6] >> 8 == 0) {
      (&local_d8)[p_out._4_4_] = 1;
    }
    else if (xor2[(ulong)p_out._4_4_ + 6] >> 0x10 == 0) {
      (&local_d8)[p_out._4_4_] = 2;
      if (bcode[(ulong)p_out._4_4_ + 6] >> 8 == 0) {
        (&local_d8)[p_out._4_4_] = 5;
      }
    }
    else if (xor2[(ulong)p_out._4_4_ + 6] >> 0x18 == 0) {
      (&local_d8)[p_out._4_4_] = 3;
      if (bcode[(ulong)p_out._4_4_ + 6] >> 8 == 0) {
        (&local_d8)[p_out._4_4_] = 5;
      }
      else if (bcode[(ulong)p_out._4_4_ + 6] >> 0x10 == 0) {
        (&local_d8)[p_out._4_4_] = 6;
      }
    }
    else if (bcode[(ulong)p_out._4_4_ + 6] >> 8 == 0) {
      (&local_d8)[p_out._4_4_] = 5;
    }
    else if (bcode[(ulong)p_out._4_4_ + 6] >> 0x10 == 0) {
      (&local_d8)[p_out._4_4_] = 6;
    }
    else if (bcode[(ulong)p_out._4_4_ + 6] >> 0x18 == 0) {
      (&local_d8)[p_out._4_4_] = 7;
    }
    if (p_out._4_4_ == 7) {
      trico_fill_code((uint8_t **)&i,xor2 + 6,bcode + 6,&local_d8);
    }
    hash2 = (uint32_t)value_00;
    _hash1_size_exponent_local = _hash1_size_exponent_local + 1;
  }
  while (local_f4 = local_f4 + 1, local_f4 < 8) {
    (&local_d8)[local_f4] = 1;
    xor2[(ulong)local_f4 + 6] = 0;
  }
  if (p_out._4_4_ != 7) {
    trico_fill_code((uint8_t **)&i,xor2 + 6,bcode + 6,&local_d8);
  }
  *nr_of_compressed_bytes = (int)_i - (int)*out;
  trico_free(ptr);
  trico_free(ptr_00);
  puVar4 = (uint8_t *)trico_realloc(*out,(ulong)*nr_of_compressed_bytes);
  *out = puVar4;
  return;
}

Assistant:

void trico_compress(uint32_t* nr_of_compressed_bytes, uint8_t** out, const float* input, const uint32_t number_of_floats, uint32_t hash1_size_exponent, uint32_t hash2_size_exponent)
  {
  hash1_size_exponent = (hash1_size_exponent >> 1) << 1;
  hash2_size_exponent = (hash2_size_exponent >> 1) << 1;
  if (hash1_size_exponent > 30)
    hash1_size_exponent = 30;
  if (hash2_size_exponent > 30)
    hash2_size_exponent = 30;

  uint32_t max_size = (number_of_floats) * sizeof(float) + 3 * (number_of_floats + 7) / 8 + (number_of_floats & 7); // theoretical maximum
  *out = (uint8_t*)trico_malloc(max_size);


  const uint32_t hash1_size = 1 << hash1_size_exponent;
  const uint32_t hash2_size = 1 << hash2_size_exponent;
  const uint32_t hash1_mask = hash1_size - 1;
  const uint32_t hash2_mask = hash2_size - 1;

  uint32_t* hash_table_1 = (uint32_t*)trico_calloc(hash1_size, 4);
  uint32_t* hash_table_2 = (uint32_t*)trico_calloc(hash2_size, 4);

  uint32_t value;
  uint32_t stride;
  uint32_t last_value = 0;
  uint32_t hash1 = 0;
  uint32_t hash2 = 0;
  uint32_t prediction1 = 0;
  uint32_t prediction2 = 0;
  uint32_t xor1[8];
  uint32_t xor2[8];
  uint32_t bcode[8];
  uint32_t j = 0;
  uint8_t* p_out = *out;

  uint8_t hash_info = (uint8_t)(((hash1_size_exponent >> 1) << 4) | (hash2_size_exponent >> 1));
  *p_out++ = hash_info;

  *p_out++ = (uint8_t)((number_of_floats >> 24));
  *p_out++ = (uint8_t)((number_of_floats >> 16) & 0xff);
  *p_out++ = (uint8_t)((number_of_floats >> 8) & 0xff);
  *p_out++ = (uint8_t)((number_of_floats) & 0xff);

  for (uint32_t i = 0; i < number_of_floats; ++i)
    {
    j = i & 7;
    value = *(const uint32_t*)(input++);

    xor1[j] = value ^ prediction1;
    hash_table_1[hash1] = value;
    hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
    prediction1 = hash_table_1[hash1];

    stride = value - last_value;
    xor2[j] = value ^ (last_value + prediction2);
    last_value = value;
    hash_table_2[hash2] = stride;
    hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
    prediction2 = hash_table_2[hash2];


    bcode[j] = 4; // 4 bytes
    if (0 == xor1[j])
      {
      bcode[j] = 0; // 0 bytes
      }
    else if (0 == (xor1[j] >> 8))
      {
      bcode[j] = 1; // 1 byte
      }
    else if (0 == (xor1[j] >> 16))
      {
      bcode[j] = 2; // 2 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      }
    else if (0 == (xor1[j] >> 24))
      {
      bcode[j] = 3; // 3 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 6; // 2 bytes
        }
      }
    else // 4 bytes
      {
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 6; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 7; // 3 bytes
        }
      }

    if (j == 7)
      {
      trico_fill_code(&p_out, xor1, xor2, bcode);
      }
    }
  for (uint32_t l = j + 1; l < 8; ++l)
    {
    bcode[l] = 1;
    xor1[l] = 0;
    }
  if (j != 7)
    {
    trico_fill_code(&p_out, xor1, xor2, bcode);
    }

  *nr_of_compressed_bytes = (uint32_t)(p_out - *out);
  trico_free(hash_table_1);
  trico_free(hash_table_2);
  *out = (uint8_t*)trico_realloc(*out, *nr_of_compressed_bytes);
  }